

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

string * __thiscall pbrt::ThreadPool::ToString_abi_cxx11_(ThreadPool *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  ParallelJob *job;
  string s;
  string local_90 [8];
  bool *in_stack_ffffffffffffff78;
  unsigned_long *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_70 [32];
  long *local_50;
  size_type local_38;
  string local_30 [48];
  
  local_38 = std::vector<std::thread,_std::allocator<std::thread>_>::size
                       ((vector<std::thread,_std::allocator<std::thread>_> *)(in_RSI + 3));
  StringPrintf<unsigned_long,bool_const&>
            ((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = std::mutex::try_lock((mutex *)in_RDI);
  if (bVar1) {
    std::__cxx11::string::operator+=(local_30,"jobList: [ ");
    for (local_50 = *(long **)in_RSI; local_50 != (long *)0x0; local_50 = (long *)local_50[2]) {
      (**(code **)(*local_50 + 0x20))(local_90);
      std::operator+(in_RSI,(char *)in_RDI);
      std::__cxx11::string::operator+=(local_30,local_70);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
    }
    std::__cxx11::string::operator+=(local_30,"] ");
    std::mutex::unlock((mutex *)0x52863a);
  }
  else {
    std::__cxx11::string::operator+=(local_30,"(job list mutex locked) ");
  }
  std::operator+(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string ThreadPool::ToString() const {
    std::string s = StringPrintf("[ ThreadPool threads.size(): %d shutdownThreads: %s ",
                                 threads.size(), shutdownThreads);
    if (jobListMutex.try_lock()) {
        s += "jobList: [ ";
        ParallelJob *job = jobList;
        while (job) {
            s += job->ToString() + " ";
            job = job->next;
        }
        s += "] ";
        jobListMutex.unlock();
    } else
        s += "(job list mutex locked) ";
    return s + "]";
}